

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_animators.cpp
# Opt level: O0

void timing_web_validate(Am_Web_Events *events)

{
  bool bVar1;
  Am_Slot_Key AVar2;
  int iVar3;
  Am_Value *pAVar4;
  unsigned_long uVar5;
  Am_Wrapper *pAVar6;
  ulong uVar7;
  float fVar8;
  float local_108;
  float local_f0;
  Am_Time local_78;
  Am_Time local_70;
  Am_Time local_68;
  Am_Slot_Data *local_60;
  ushort local_56;
  float local_54;
  Am_Slot_Key timing_mode;
  float length;
  Am_Time duration;
  float velocity;
  Am_Time fixed_duration;
  float fixed_velocity;
  Am_Object local_28;
  Am_Object local_20;
  Am_Object self;
  Am_Slot slot;
  Am_Web_Events *events_local;
  
  Am_Web_Events::Start(events);
  self.data = (Am_Object_Data *)Am_Web_Events::Get(events);
  Am_Slot::Get_Owner((Am_Slot *)&local_28);
  Am_Object::Am_Object(&local_20,&local_28);
  Am_Object_Advanced::~Am_Object_Advanced((Am_Object_Advanced *)&local_28);
  pAVar4 = Am_Object::Get(&local_20,0xfc,0);
  fixed_duration.data._0_4_ = Am_Value::operator_cast_to_float(pAVar4);
  pAVar4 = Am_Object::Get(&local_20,0xfd,0);
  Am_Time::Am_Time((Am_Time *)&stack0xffffffffffffffc0,pAVar4);
  duration.data._4_4_ = fixed_duration.data._0_4_;
  Am_Time::Am_Time((Am_Time *)&stack0xffffffffffffffb0,(Am_Time *)&stack0xffffffffffffffc0);
  pAVar4 = Am_Object::Get(&local_20,0xf8,0);
  local_54 = Am_Value::operator_cast_to_float(pAVar4);
  pAVar4 = Am_Object::Get(&local_20,0x100,0);
  iVar3 = Am_Value::operator_cast_to_int(pAVar4);
  local_56 = (ushort)iVar3;
  Am_Web_Events::Start(events);
  while (bVar1 = Am_Web_Events::Last(events), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_60 = (Am_Slot_Data *)Am_Web_Events::Get(events);
    self.data = (Am_Object_Data *)local_60;
    AVar2 = Am_Slot::Get_Key((Am_Slot *)&self);
    switch(AVar2) {
    case 0xf8:
    case 0x100:
      if (local_56 == 0xfc) {
        fVar8 = (local_54 * 1000.0) / fixed_duration.data._0_4_;
        uVar7 = (ulong)fVar8;
        Am_Time::Am_Time(&local_78,uVar7 | (long)(fVar8 - 9.223372e+18) & (long)uVar7 >> 0x3f);
        Am_Time::operator=((Am_Time *)&stack0xffffffffffffffb0,&local_78);
        Am_Time::~Am_Time(&local_78);
      }
      else {
        fVar8 = local_54 * 1000.0;
        uVar5 = Am_Time::Milliseconds((Am_Time *)&stack0xffffffffffffffc0);
        local_108 = (float)uVar5;
        duration.data._4_4_ = fVar8 / local_108;
      }
      break;
    case 0xfc:
      if (0.0 < fixed_duration.data._0_4_) {
        fVar8 = (local_54 * 1000.0) / fixed_duration.data._0_4_;
        uVar7 = (ulong)fVar8;
        Am_Time::Am_Time(&local_68,uVar7 | (long)(fVar8 - 9.223372e+18) & (long)uVar7 >> 0x3f);
        Am_Time::operator=((Am_Time *)&stack0xffffffffffffffb0,&local_68);
        Am_Time::~Am_Time(&local_68);
        Am_Time::Am_Time(&local_70,0);
        Am_Time::operator=((Am_Time *)&stack0xffffffffffffffc0,&local_70);
        Am_Time::~Am_Time(&local_70);
        local_56 = 0xfc;
      }
      break;
    case 0xfd:
      bVar1 = Am_Time::Valid((Am_Time *)&stack0xffffffffffffffc0);
      if ((bVar1) &&
         (uVar5 = Am_Time::Milliseconds((Am_Time *)&stack0xffffffffffffffc0), uVar5 != 0)) {
        fVar8 = local_54 * 1000.0;
        uVar5 = Am_Time::Milliseconds((Am_Time *)&stack0xffffffffffffffc0);
        local_f0 = (float)uVar5;
        duration.data._4_4_ = fVar8 / local_f0;
        fixed_duration.data._0_4_ = 0.0;
        local_56 = 0xfd;
      }
    }
    Am_Web_Events::Next(events);
  }
  Am_Object::Set(&local_20,0xfc,fixed_duration.data._0_4_,0);
  pAVar6 = Am_Time::operator_cast_to_Am_Wrapper_((Am_Time *)&stack0xffffffffffffffc0);
  Am_Object::Set(&local_20,0xfd,pAVar6,0);
  Am_Object::Set(&local_20,0xfe,duration.data._4_4_,0);
  pAVar6 = Am_Time::operator_cast_to_Am_Wrapper_((Am_Time *)&stack0xffffffffffffffb0);
  Am_Object::Set(&local_20,0xff,pAVar6,0);
  Am_Object::Set(&local_20,0x100,(uint)local_56,0);
  Am_Time::~Am_Time((Am_Time *)&stack0xffffffffffffffb0);
  Am_Time::~Am_Time((Am_Time *)&stack0xffffffffffffffc0);
  Am_Object::~Am_Object(&local_20);
  return;
}

Assistant:

void
timing_web_validate(Am_Web_Events &events)
{
  events.Start();
  Am_Slot slot = events.Get();
  Am_Object self = slot.Get_Owner();
  float fixed_velocity = self.Get(Am_VELOCITY);
  Am_Time fixed_duration = self.Get(Am_DURATION);
  float velocity = fixed_velocity;
  Am_Time duration = fixed_duration;
  float length = self.Get(Am_PATH_LENGTH);
  Am_Slot_Key timing_mode = (int)self.Get(Am_TIMING_MODE);

  events.Start();
  while (!events.Last()) {
    slot = events.Get();
    switch (slot.Get_Key()) {
    case Am_VELOCITY:
      // std::cout << self << " VELOCITY <- " << velocity <<std::endl;
      if (fixed_velocity > 0) {
        duration = Am_Time((unsigned long)((1000 * length) / fixed_velocity));
        fixed_duration = Am_Time((unsigned long)0);
        timing_mode = Am_VELOCITY;
      }
      break;

    case Am_DURATION:
      // std::cout << self << " DURATION <- " << duration <<std::endl;
      if (fixed_duration.Valid() && fixed_duration.Milliseconds() > 0) {
        velocity = (1000 * length) / (float)fixed_duration.Milliseconds();
        fixed_velocity = 0;
        timing_mode = Am_DURATION;
      }
      break;

    case Am_PATH_LENGTH:
    case Am_TIMING_MODE:
      // std::cout << self << " LENGTH <- " << length <<std::endl;
      if (timing_mode == Am_VELOCITY) {
        // std::cout << "\tMODE = velocity" <<std::endl;
        duration = Am_Time((unsigned long)(1000 * length / fixed_velocity));
      } else {
        // std::cout << "\tMODE = duration" <<std::endl;
        velocity = (1000 * length) / (float)fixed_duration.Milliseconds();
      }
      break;
    }
    events.Next();
  }
  self.Set(Am_VELOCITY, fixed_velocity);
  self.Set(Am_DURATION, fixed_duration);
  self.Set(Am_CURRENT_VELOCITY, velocity);
  self.Set(Am_CURRENT_DURATION, duration);
  self.Set(Am_TIMING_MODE, (int)timing_mode);
}